

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifCount.h
# Opt level: O2

word If_CutPinDelayMax(word D1,word D2,int nVars,int AddOn)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar7 = 0;
  uVar4 = (ulong)(uint)nVars;
  if (nVars < 1) {
    uVar4 = uVar7;
  }
  uVar5 = 0;
  uVar6 = 0;
  do {
    if (uVar4 == uVar5) {
      return uVar6;
    }
    uVar1 = If_CutPinDelayGet(D1,(int)uVar5);
    uVar2 = If_CutPinDelayGet(D2,(int)uVar5);
    if (uVar2 < uVar1) {
      uVar2 = uVar1;
    }
    if (uVar2 != 0) {
      if (0xf < uVar5) {
        __assert_fail("v >= 0 && v < 16",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifCount.h"
                      ,0x91,"void If_CutPinDelaySet(word *, int, int)");
      }
      uVar3 = (ulong)uVar2;
      if (0xd < uVar2) {
        uVar3 = 0xe;
      }
      uVar6 = uVar6 | uVar3 + 1 << ((byte)uVar7 & 0x3f);
    }
    uVar5 = uVar5 + 1;
    uVar7 = uVar7 + 4;
  } while( true );
}

Assistant:

static inline word If_CutPinDelayMax( word D1, word D2, int nVars, int AddOn )
{
    int v, Max;
    word D = 0;
    for ( v = 0; v < nVars; v++ )
        if ( (Max = Abc_MaxInt(If_CutPinDelayGet(D1, v), If_CutPinDelayGet(D2, v))) )
            If_CutPinDelaySet( &D, v, Abc_MinInt(Max + AddOn, 15) );
    return D;
}